

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_select.c
# Opt level: O1

ssize_t tnt_select(tnt_stream *s,uint32_t space,uint32_t index,uint32_t limit,uint32_t offset,
                  uint8_t iterator,tnt_stream *key)

{
  char cVar1;
  int iVar2;
  undefined4 *puVar3;
  ulong uVar4;
  ssize_t sVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  undefined3 in_register_00000089;
  undefined2 local_e8;
  undefined1 local_e6;
  undefined1 auStack_e5 [2];
  undefined1 auStack_e3 [3];
  char body [64];
  iovec v [4];
  tnt_iheader hdr;
  char len_prefix [9];
  
  hdr.end._0_4_ = CONCAT31(in_register_00000089,iterator);
  iVar2 = tnt_object_verify(key,'\x05');
  if (iVar2 != 0) {
    return -1;
  }
  uVar4 = s->reqid;
  s->reqid = uVar4 + 1;
  v[3].iov_len._5_1_ = '\0';
  v[3].iov_len._6_1_ = '\0';
  v[3].iov_len._7_1_ = '\0';
  hdr.header[0] = '\0';
  hdr.header[1] = '\0';
  hdr.header[2] = '\0';
  hdr.header[3] = '\0';
  hdr.header[4] = '\0';
  hdr.header[5] = '\0';
  hdr.header[6] = '\0';
  hdr.header[7] = '\0';
  hdr.header[8] = '\0';
  hdr.header[9] = '\0';
  hdr.header[10] = '\0';
  hdr.header[0xb] = '\0';
  hdr.header[0xc] = '\0';
  hdr.header[0xd] = '\0';
  hdr.header[0xe] = '\0';
  hdr.header[0xf] = '\0';
  hdr.header[0x10] = '\0';
  hdr.header[0x11] = '\0';
  hdr.header[0x12] = '\0';
  hdr.header[0x13] = '\0';
  hdr.header[0x14] = '\0';
  hdr.header[0x15] = '\0';
  hdr.header[0x16] = '\0';
  hdr.header[0x17] = '\0';
  v[3].iov_len._0_4_ = 0x1010082;
  cVar1 = (char)uVar4;
  if (uVar4 < 0x80) {
    hdr._24_8_ = (long)&v[3].iov_len + 5;
    v[3].iov_len._4_1_ = cVar1;
    v[1].iov_base = (void *)0x5;
  }
  else if (uVar4 < 0x100) {
    hdr._24_8_ = (long)&v[3].iov_len + 6;
    v[3].iov_len._4_1_ = -0x34;
    v[3].iov_len._5_1_ = cVar1;
    v[1].iov_base = (void *)0x6;
  }
  else {
    v[3].iov_len._5_1_ = (char)(uVar4 >> 8);
    if (uVar4 < 0x10000) {
      hdr._24_8_ = (long)&v[3].iov_len + 7;
      v[3].iov_len._4_1_ = -0x33;
      v[1].iov_base = (void *)0x7;
      v[3].iov_len._6_1_ = cVar1;
    }
    else if (uVar4 >> 0x20 == 0) {
      hdr._24_8_ = hdr.header + 1;
      v[3].iov_len._4_1_ = -0x32;
      v[3].iov_len._6_1_ = (char)(uVar4 >> 0x10);
      v[3].iov_len._7_1_ = v[3].iov_len._5_1_;
      v[3].iov_len._5_1_ = (char)(uVar4 >> 0x18);
      v[1].iov_base = (void *)0x9;
      hdr.header[0] = cVar1;
    }
    else {
      hdr._24_8_ = hdr.header + 5;
      v[3].iov_len._4_1_ = -0x31;
      v[3].iov_len._6_1_ = (char)(uVar4 >> 0x30);
      v[3].iov_len._7_1_ = (char)(uVar4 >> 0x28);
      hdr.header[0] = (char)(uVar4 >> 0x20);
      hdr.header._1_4_ =
           (uint)(uVar4 >> 0x18) & 0xff | (uint)(uVar4 >> 8) & 0xff00 |
           (uint)(((uVar4 & 0xff00) << 0x28) >> 0x20) | (uint)((uVar4 << 0x38) >> 0x20);
      v[3].iov_len._5_1_ = (char)(uVar4 >> 0x38);
      v[1].iov_base = (void *)0xd;
    }
  }
  v[0].iov_len = (size_t)&v[3].iov_len;
  local_e8 = 0x1086;
  if (space < 0x80) {
    puVar3 = (undefined4 *)auStack_e5;
  }
  else {
    if (0xff < space) {
      if (space < 0x10000) {
        puVar3 = (undefined4 *)((long)auStack_e5 + 2);
        local_e6 = 0xcd;
        _auStack_e5 = CONCAT22(auStack_e3._0_2_,(ushort)space << 8 | (ushort)space >> 8);
      }
      else {
        puVar3 = (undefined4 *)((long)auStack_e3 + 2);
        local_e6 = 0xce;
        _auStack_e5 = space >> 0x18 | (space & 0xff0000) >> 8 | (space & 0xff00) << 8 |
                      space << 0x18;
      }
      goto LAB_00108765;
    }
    puVar3 = (undefined4 *)((long)auStack_e5 + 1);
    local_e6 = 0xcc;
  }
  *(char *)((long)puVar3 + -1) = (char)space;
LAB_00108765:
  *(undefined1 *)puVar3 = 0x11;
  if (index < 0x80) {
    *(char *)((long)puVar3 + 1) = (char)index;
    lVar6 = 2;
  }
  else if (index < 0x100) {
    *(undefined1 *)((long)puVar3 + 1) = 0xcc;
    *(char *)((long)puVar3 + 2) = (char)index;
    lVar6 = 3;
  }
  else if (index < 0x10000) {
    *(undefined1 *)((long)puVar3 + 1) = 0xcd;
    *(ushort *)((long)puVar3 + 2) = (ushort)index << 8 | (ushort)index >> 8;
    lVar6 = 4;
  }
  else {
    *(undefined1 *)((long)puVar3 + 1) = 0xce;
    *(uint32_t *)((long)puVar3 + 2) =
         index >> 0x18 | (index & 0xff0000) >> 8 | (index & 0xff00) << 8 | index << 0x18;
    lVar6 = 6;
  }
  *(undefined1 *)((long)puVar3 + lVar6) = 0x12;
  if (limit < 0x80) {
    *(char *)((long)puVar3 + lVar6 + 1) = (char)limit;
    lVar7 = 2;
  }
  else if (limit < 0x100) {
    *(undefined1 *)((long)puVar3 + lVar6 + 1) = 0xcc;
    *(char *)((long)puVar3 + lVar6 + 2) = (char)limit;
    lVar7 = 3;
  }
  else if (limit < 0x10000) {
    *(undefined1 *)((long)puVar3 + lVar6 + 1) = 0xcd;
    *(ushort *)((long)puVar3 + lVar6 + 2) = (ushort)limit << 8 | (ushort)limit >> 8;
    lVar7 = 4;
  }
  else {
    *(undefined1 *)((long)puVar3 + lVar6 + 1) = 0xce;
    *(uint32_t *)((long)puVar3 + lVar6 + 2) =
         limit >> 0x18 | (limit & 0xff0000) >> 8 | (limit & 0xff00) << 8 | limit << 0x18;
    lVar7 = 6;
  }
  lVar8 = lVar7 + lVar6;
  *(undefined1 *)((long)puVar3 + lVar7 + lVar6) = 0x13;
  if (offset < 0x80) {
    *(char *)((long)puVar3 + lVar8 + 1) = (char)offset;
    lVar6 = 2;
  }
  else if (offset < 0x100) {
    *(undefined1 *)((long)puVar3 + lVar8 + 1) = 0xcc;
    *(char *)((long)puVar3 + lVar8 + 2) = (char)offset;
    lVar6 = 3;
  }
  else if (offset < 0x10000) {
    *(undefined1 *)((long)puVar3 + lVar8 + 1) = 0xcd;
    *(ushort *)((long)puVar3 + lVar8 + 2) = (ushort)offset << 8 | (ushort)offset >> 8;
    lVar6 = 4;
  }
  else {
    *(undefined1 *)((long)puVar3 + lVar8 + 1) = 0xce;
    *(uint32_t *)((long)puVar3 + lVar8 + 2) =
         offset >> 0x18 | (offset & 0xff0000) >> 8 | (offset & 0xff00) << 8 | offset << 0x18;
    lVar6 = 6;
  }
  lVar7 = lVar6 + lVar8;
  *(undefined1 *)((long)puVar3 + lVar6 + lVar8) = 0x14;
  if ((char)hdr.end._0_4_ < '\0') {
    *(undefined1 *)((long)puVar3 + lVar7 + 1) = 0xcc;
    lVar6 = lVar7 + 2;
    lVar8 = 3;
  }
  else {
    lVar6 = lVar6 + lVar8 + 1;
    lVar8 = 2;
  }
  *(char *)((long)puVar3 + lVar6) = (char)hdr.end._0_4_;
  *(undefined1 *)((long)puVar3 + lVar8 + lVar7) = 0x20;
  v[1].iov_len = (size_t)&local_e8;
  v[2].iov_base = (undefined1 *)((long)puVar3 + ((lVar8 + lVar7) - (long)&local_e8) + 1);
  v[2].iov_len = *key->data;
  v[3].iov_base = *(void **)((long)key->data + 8);
  lVar6 = 0x18;
  uVar4 = 0;
  do {
    uVar4 = uVar4 + *(long *)(body + lVar6 + 0x38);
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x48);
  if (uVar4 >> 0x20 == 0) {
    hdr.end._7_1_ = 0xce;
    v[0].iov_base = (void *)0x5;
  }
  else {
    hdr.end._7_1_ = 0xcf;
    v[0].iov_base = (void *)0x9;
  }
  body._56_8_ = (long)&hdr.end + 7;
  sVar5 = (*s->writev)(s,(iovec *)(body + 0x38),4);
  return sVar5;
}

Assistant:

ssize_t
tnt_select(struct tnt_stream *s, uint32_t space, uint32_t index,
	   uint32_t limit, uint32_t offset, uint8_t iterator,
	   struct tnt_stream *key)
{
	if (tnt_object_verify(key, MP_ARRAY))
		return -1;
	struct tnt_iheader hdr;
	struct iovec v[4]; int v_sz = 4;
	char *data = NULL;
	encode_header(&hdr, TNT_OP_SELECT, s->reqid++);
	v[1].iov_base = (void *)hdr.header;
	v[1].iov_len  = hdr.end - hdr.header;
	char body[64]; data = body;

	data = mp_encode_map(data, 6);
	data = mp_encode_uint(data, TNT_SPACE);
	data = mp_encode_uint(data, space);
	data = mp_encode_uint(data, TNT_INDEX);
	data = mp_encode_uint(data, index);
	data = mp_encode_uint(data, TNT_LIMIT);
	data = mp_encode_uint(data, limit);
	data = mp_encode_uint(data, TNT_OFFSET);
	data = mp_encode_uint(data, offset);
	data = mp_encode_uint(data, TNT_ITERATOR);
	data = mp_encode_uint(data, iterator);
	data = mp_encode_uint(data, TNT_KEY);
	v[2].iov_base = body;
	v[2].iov_len  = data - body;
	v[3].iov_base = TNT_SBUF_DATA(key);
	v[3].iov_len  = TNT_SBUF_SIZE(key);

	size_t package_len = 0;
	for (int i = 1; i < v_sz; ++i)
		package_len += v[i].iov_len;
	char len_prefix[9];
	char *len_end = mp_encode_luint32(len_prefix, package_len);
	v[0].iov_base = len_prefix;
	v[0].iov_len = len_end - len_prefix;
	return s->writev(s, v, v_sz);
}